

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_xmlerror(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int test_ret;
  uint uVar10;
  bool bVar11;
  uint local_34;
  
  if (quiet == '\0') {
    puts("Testing xmlerror : 6 of 17 functions ...");
  }
  iVar2 = xmlMemBlocks();
  xmlCopyError(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar3 = xmlMemBlocks();
  if (iVar2 != iVar3) {
    iVar4 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlCopyError",(ulong)(uint)(iVar4 - iVar2));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar10 = 0;
  iVar4 = 0;
  bVar1 = true;
  do {
    bVar11 = bVar1;
    iVar5 = xmlMemBlocks();
    xmlCtxtResetLastError(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCtxtResetLastError",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d",(ulong)uVar10);
      putchar(10);
    }
    uVar10 = 1;
    bVar1 = false;
  } while (bVar11);
  function_tests = function_tests + 1;
  local_34 = (uint)(iVar2 != iVar3);
  iVar2 = xmlMemBlocks();
  xmlParserPrintFileContext(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar3 = xmlMemBlocks();
  if (iVar2 != iVar3) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlParserPrintFileContext",(ulong)(uint)(iVar5 - iVar2));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  xmlParserPrintFileInfo(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    iVar7 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlParserPrintFileInfo",(ulong)(uint)(iVar7 - iVar5));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  xmlResetError(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar7 != iVar8) {
    iVar9 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlResetError",(ulong)(uint)(iVar9 - iVar7));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  xmlResetLastError();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  uVar10 = iVar4 + local_34 + (uint)(iVar2 != iVar3) + (uint)(iVar5 != iVar6) +
           (uint)(iVar7 != iVar8);
  if (uVar10 != 0) {
    printf("Module xmlerror: %d errors\n",(ulong)uVar10);
  }
  return uVar10;
}

Assistant:

static int
test_xmlerror(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlerror : 6 of 17 functions ...\n");
    test_ret += test_xmlCopyError();
    test_ret += test_xmlCtxtGetLastError();
    test_ret += test_xmlCtxtResetLastError();
    test_ret += test_xmlFormatError();
    test_ret += test_xmlGetLastError();
    test_ret += test_xmlParserError();
    test_ret += test_xmlParserPrintFileContext();
    test_ret += test_xmlParserPrintFileInfo();
    test_ret += test_xmlParserValidityError();
    test_ret += test_xmlParserValidityWarning();
    test_ret += test_xmlParserWarning();
    test_ret += test_xmlResetError();
    test_ret += test_xmlResetLastError();
    test_ret += test_xmlSetGenericErrorFunc();
    test_ret += test_xmlSetStructuredErrorFunc();
    test_ret += test_xmlThrDefSetGenericErrorFunc();
    test_ret += test_xmlThrDefSetStructuredErrorFunc();

    if (test_ret != 0)
	printf("Module xmlerror: %d errors\n", test_ret);
    return(test_ret);
}